

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int selectExpander(Walker *pWalker,Select *p)

{
  ushort uVar1;
  i16 iVar2;
  uint uVar3;
  Parse *pParse_00;
  sqlite3 *db_00;
  SrcList *pList;
  ExprList *pList_00;
  Expr *pEVar4;
  ulong uVar5;
  Db *pDVar6;
  sqlite3 *zName_00;
  bool bVar7;
  int iVar8;
  int iVar9;
  With *pWVar10;
  Table *pTable;
  Select *pSVar11;
  Expr *pEVar12;
  char *pcVar13;
  u32 uVar14;
  char *local_128;
  Expr *pLeft;
  ExprList_item *pX_1;
  char *zName;
  ExprList_item *pX;
  char *zUName;
  IdList *pIStack_e8;
  int ii;
  IdList *pUsing;
  char *pcStack_d8;
  int iDb;
  char *zSchemaName;
  char *zTabName;
  ExprList *pNestedFrom;
  Table *pTab_1;
  char *zTName;
  int tableSeen;
  int longNames;
  int flags;
  ExprList *pNew;
  ExprList_item *a;
  u8 eCodeOrig;
  i16 nCol;
  Select *pSel;
  Table *pTab;
  u32 elistFlags;
  u16 selFlags;
  Expr *pExpr;
  Expr *pRight;
  Expr *pE;
  sqlite3 *db;
  SrcItem *pFrom;
  ExprList *pEList;
  SrcList *pTabList;
  int rc;
  int k;
  int j;
  int i;
  Parse *pParse;
  Select *p_local;
  Walker *pWalker_local;
  
  pParse_00 = pWalker->pParse;
  db_00 = pParse_00->db;
  uVar3 = p->selFlags;
  pTab._0_4_ = 0;
  p->selFlags = p->selFlags | 0x40;
  if (db_00->mallocFailed == '\0') {
    if ((uVar3 & 0x40) == 0) {
      if (pWalker->eCode != 0) {
        uVar14 = pParse_00->nSelect + 1;
        pParse_00->nSelect = uVar14;
        p->selId = uVar14;
      }
      pList = p->pSrc;
      pList_00 = p->pEList;
      if ((pParse_00->pWith != (With *)0x0) && ((p->selFlags & 0x200000) != 0)) {
        if (p->pWith == (With *)0x0) {
          pWVar10 = (With *)sqlite3DbMallocZero(db_00,0x40);
          p->pWith = pWVar10;
          if (p->pWith == (With *)0x0) {
            return 2;
          }
        }
        p->pWith->bView = 1;
      }
      sqlite3WithPush(pParse_00,p->pWith,'\0');
      sqlite3SrcListAssignCursors(pParse_00,pList);
      db = (sqlite3 *)pList->a;
      for (k = 0; k < pList->nSrc; k = k + 1) {
        if (db->aDb == (Db *)0x0) {
          if (db->pDfltColl == (CollSeq *)0x0) {
            iVar8 = sqlite3WalkSelect(pWalker,*(Select **)&db->nDb);
            if (iVar8 != 0) {
              return 2;
            }
            iVar8 = sqlite3ExpandSubquery(pParse_00,(SrcItem *)db);
            if (iVar8 != 0) {
              return 2;
            }
          }
          else {
            iVar8 = resolveFromTermToCte(pParse_00,pWalker,(SrcItem *)db);
            if (iVar8 == 0) {
              pTable = sqlite3LocateTableItem(pParse_00,0,(SrcItem *)db);
              db->aDb = (Db *)pTable;
              if (pTable == (Table *)0x0) {
                return 2;
              }
              if (0xfffe < pTable->nTabRef) {
                sqlite3ErrorMsg(pParse_00,"too many references to \"%s\": max 65535",pTable->zName);
                db->aDb = (Db *)0x0;
                return 2;
              }
              pTable->nTabRef = pTable->nTabRef + 1;
              if ((pTable->eTabType != '\x01') &&
                 (iVar8 = cannotBeFunction(pParse_00,(SrcItem *)db), iVar8 != 0)) {
                return 2;
              }
              if (pTable->eTabType != '\0') {
                uVar1 = pWalker->eCode;
                iVar8 = sqlite3ViewGetColumnNames(pParse_00,pTable);
                if (iVar8 != 0) {
                  return 2;
                }
                if (pTable->eTabType == '\x02') {
                  if (((db_00->flags & 0x80000000) == 0) &&
                     (pTable->pSchema != db_00->aDb[1].pSchema)) {
                    sqlite3ErrorMsg(pParse_00,"access to view \"%s\" prohibited",pTable->zName);
                  }
                  pSVar11 = sqlite3SelectDup(db_00,(pTable->u).view.pSelect,0);
                  *(Select **)&db->nDb = pSVar11;
                }
                else if ((((pTable->eTabType == '\x01') &&
                          ((*(ushort *)((long)&db->lastRowid + 5) >> 7 & 1) != 0)) &&
                         ((pTable->u).tab.pDfltList != (ExprList *)0x0)) &&
                        (((db_00->flags & 0x80) != 0) < ((pTable->u).vtab.p)->eVtabRisk)) {
                  sqlite3ErrorMsg(pParse_00,"unsafe use of virtual table \"%s\"",pTable->zName);
                }
                iVar2 = pTable->nCol;
                pTable->nCol = -1;
                pWalker->eCode = 1;
                sqlite3WalkSelect(pWalker,*(Select **)&db->nDb);
                pWalker->eCode = uVar1 & 0xff;
                pTable->nCol = iVar2;
              }
            }
            else if (1 < iVar8) {
              return 2;
            }
          }
          if (((*(ushort *)((long)&db->lastRowid + 5) >> 1 & 1) != 0) &&
             (iVar8 = sqlite3IndexedByLookup(pParse_00,(SrcItem *)db), iVar8 != 0)) {
            return 2;
          }
        }
        db = (sqlite3 *)&db->bBenignMalloc;
      }
      if ((pParse_00->nErr == 0) && (iVar8 = sqlite3ProcessJoin(pParse_00,p), iVar8 == 0)) {
        pTabList._4_4_ = 0;
        while (((pTabList._4_4_ < pList_00->nExpr &&
                (pEVar4 = pList_00->a[pTabList._4_4_].pExpr, pEVar4->op != 0xb4)) &&
               ((pEVar4->op != 0x8d || (pEVar4->pRight->op != 0xb4))))) {
          pTab._0_4_ = pEVar4->flags | (uint)pTab;
          pTabList._4_4_ = pTabList._4_4_ + 1;
        }
        if (pTabList._4_4_ < pList_00->nExpr) {
          _longNames = (ExprList *)0x0;
          uVar5 = pParse_00->db->flags;
          for (pTabList._4_4_ = 0; pTabList._4_4_ < pList_00->nExpr;
              pTabList._4_4_ = pTabList._4_4_ + 1) {
            pEVar4 = pList_00->a[pTabList._4_4_].pExpr;
            pTab._0_4_ = pEVar4->flags | (uint)pTab;
            if ((pEVar4->op == 0xb4) || ((pEVar4->op == 0x8d && (pEVar4->pRight->op == 0xb4)))) {
              bVar7 = false;
              pTab_1 = (Table *)0x0;
              if (pEVar4->op == 0x8d) {
                pTab_1 = (Table *)(pEVar4->pLeft->u).zToken;
              }
              db = (sqlite3 *)pList->a;
              for (k = 0; k < pList->nSrc; k = k + 1) {
                pDVar6 = db->aDb;
                pcStack_d8 = (char *)0x0;
                zSchemaName = (char *)db->mutex;
                if ((sqlite3_mutex *)zSchemaName == (sqlite3_mutex *)0x0) {
                  zSchemaName = pDVar6->zDbSName;
                }
                if (db_00->mallocFailed != '\0') break;
                if ((*(ushort *)((long)&db->lastRowid + 5) >> 0xd & 1) == 0) {
                  if ((pTab_1 == (Table *)0x0) ||
                     (iVar8 = sqlite3StrICmp((char *)pTab_1,zSchemaName), iVar8 == 0)) {
                    zTabName = (char *)0x0;
                    iVar8 = sqlite3SchemaToIndex(db_00,(Schema *)pDVar6[3].zDbSName);
                    if (iVar8 < 0) {
                      local_128 = "*";
                    }
                    else {
                      local_128 = db_00->aDb[iVar8].zDbSName;
                    }
                    pcStack_d8 = local_128;
                    goto LAB_00237838;
                  }
                }
                else {
                  zTabName = *(char **)(*(long *)&db->nDb + 0x20);
LAB_00237838:
                  if (((k + 1 < pList->nSrc) &&
                      ((*(ushort *)((long)db->aLimit + 0x1d) >> 10 & 1) != 0)) &&
                     ((uVar3 & 0x800) != 0)) {
                    pIStack_e8 = *(IdList **)(db->aLimit + 10);
                    for (zUName._4_4_ = 0; zUName._4_4_ < pIStack_e8->nId;
                        zUName._4_4_ = zUName._4_4_ + 1) {
                      pcVar13 = pIStack_e8->a[zUName._4_4_].zName;
                      pEVar12 = sqlite3Expr(db_00,0x3b,pcVar13);
                      _longNames = sqlite3ExprListAppend(pParse_00,_longNames,pEVar12);
                      if (_longNames != (ExprList *)0x0) {
                        iVar8 = _longNames->nExpr + -1;
                        pcVar13 = sqlite3MPrintf(db_00,"..%s",pcVar13);
                        _longNames->a[iVar8].zEName = pcVar13;
                        *(ushort *)&_longNames->a[iVar8].fg.field_0x1 =
                             *(ushort *)&_longNames->a[iVar8].fg.field_0x1 & 0xfffc | 2;
                        *(ushort *)&_longNames->a[iVar8].fg.field_0x1 =
                             *(ushort *)&_longNames->a[iVar8].fg.field_0x1 & 0xff7f | 0x80;
                      }
                    }
                  }
                  else {
                    pIStack_e8 = (IdList *)0x0;
                  }
                  for (rc = 0; rc < *(short *)&pDVar6[1].field_0x16; rc = rc + 1) {
                    zName_00 = (&pDVar6->pBt->db)[(long)rc * 2];
                    if ((((((pTab_1 == (Table *)0x0) || (zTabName == (char *)0x0)) ||
                          (iVar8 = sqlite3MatchEName((ExprList_item *)
                                                     (zTabName + (long)rc * 0x18 + 8),(char *)0x0,
                                                     (char *)pTab_1,(char *)0x0), iVar8 != 0)) &&
                         (((p->selFlags & 0x20000) != 0 ||
                          ((*(ushort *)((long)&pDVar6->pBt->pBt + (long)rc * 0x10 + 6) & 2) == 0))))
                        && (((*(ushort *)((long)&pDVar6->pBt->pBt + (long)rc * 0x10 + 6) & 0x400) ==
                             0 || ((pTab_1 != (Table *)0x0 || ((uVar3 & 0x800) != 0)))))) &&
                       ((bVar7 = true, k < 1 ||
                        ((((pTab_1 != (Table *)0x0 || ((uVar3 & 0x800) != 0)) ||
                          ((*(ushort *)((long)&db->lastRowid + 5) >> 10 & 1) == 0)) ||
                         (iVar8 = sqlite3IdListIndex(*(IdList **)&db->nSchemaLock,(char *)zName_00),
                         iVar8 < 0)))))) {
                      _elistFlags = sqlite3Expr(db_00,0x3b,(char *)zName_00);
                      if (((1 < pList->nSrc) &&
                          ((((db->lastRowid & 0x4000000000) == 0 || ((uVar3 & 0x800) != 0)) ||
                           (iVar8 = inAnyUsingClause((char *)zName_00,(SrcItem *)db,
                                                     (pList->nSrc - k) + -1), iVar8 == 0)))) ||
                         (1 < pParse_00->eParseMode)) {
                        pEVar12 = sqlite3Expr(db_00,0x3b,zSchemaName);
                        _elistFlags = sqlite3PExpr(pParse_00,0x8d,pEVar12,_elistFlags);
                        if ((1 < pParse_00->eParseMode) && (pEVar4->pLeft != (Expr *)0x0)) {
                          sqlite3RenameTokenRemap(pParse_00,pEVar12,pEVar4->pLeft);
                        }
                        if (pcStack_d8 != (char *)0x0) {
                          pEVar12 = sqlite3Expr(db_00,0x3b,pcStack_d8);
                          _elistFlags = sqlite3PExpr(pParse_00,0x8d,pEVar12,_elistFlags);
                        }
                      }
                      _longNames = sqlite3ExprListAppend(pParse_00,_longNames,_elistFlags);
                      if (_longNames == (ExprList *)0x0) break;
                      iVar8 = _longNames->nExpr + -1;
                      if (((uVar3 & 0x800) == 0) || (1 < pParse_00->eParseMode)) {
                        if ((uVar5 & 4) == 0 || (uVar5 & 0x40) != 0) {
                          pcVar13 = sqlite3DbStrDup(db_00,(char *)zName_00);
                          _longNames->a[iVar8].zEName = pcVar13;
                          *(ushort *)&_longNames->a[iVar8].fg.field_0x1 =
                               *(ushort *)&_longNames->a[iVar8].fg.field_0x1 & 0xfffc;
                        }
                        else {
                          pcVar13 = sqlite3MPrintf(db_00,"%s.%s",zSchemaName,zName_00);
                          _longNames->a[iVar8].zEName = pcVar13;
                          *(ushort *)&_longNames->a[iVar8].fg.field_0x1 =
                               *(ushort *)&_longNames->a[iVar8].fg.field_0x1 & 0xfffc;
                        }
                      }
                      else {
                        if (zTabName == (char *)0x0) {
                          pcVar13 = sqlite3MPrintf(db_00,"%s.%s.%s",pcStack_d8,zSchemaName,zName_00)
                          ;
                          _longNames->a[iVar8].zEName = pcVar13;
                        }
                        else {
                          pcVar13 = sqlite3DbStrDup(db_00,*(char **)(zTabName +
                                                                    (long)rc * 0x18 + 0x10));
                          _longNames->a[iVar8].zEName = pcVar13;
                        }
                        *(ushort *)&_longNames->a[iVar8].fg.field_0x1 =
                             *(ushort *)&_longNames->a[iVar8].fg.field_0x1 & 0xfffc | 2;
                        if (((((*(ushort *)((long)&db->lastRowid + 5) >> 10 & 1) != 0) &&
                             (iVar9 = sqlite3IdListIndex(*(IdList **)&db->nSchemaLock,
                                                         (char *)zName_00), -1 < iVar9)) ||
                            ((pIStack_e8 != (IdList *)0x0 &&
                             (iVar9 = sqlite3IdListIndex(pIStack_e8,(char *)zName_00), -1 < iVar9)))
                            ) || ((*(ushort *)((long)&pDVar6->pBt->pBt + (long)rc * 0x10 + 6) &
                                  0x400) != 0)) {
                          *(ushort *)&_longNames->a[iVar8].fg.field_0x1 =
                               *(ushort *)&_longNames->a[iVar8].fg.field_0x1 & 0xfeff | 0x100;
                        }
                      }
                    }
                  }
                }
                db = (sqlite3 *)&db->bBenignMalloc;
              }
              if (!bVar7) {
                if (pTab_1 == (Table *)0x0) {
                  sqlite3ErrorMsg(pParse_00,"no tables specified");
                }
                else {
                  sqlite3ErrorMsg(pParse_00,"no such table: %s",pTab_1);
                }
              }
            }
            else {
              _longNames = sqlite3ExprListAppend
                                     (pParse_00,_longNames,pList_00->a[pTabList._4_4_].pExpr);
              if (_longNames != (ExprList *)0x0) {
                _longNames->a[_longNames->nExpr + -1].zEName = pList_00->a[pTabList._4_4_].zEName;
                iVar8 = _longNames->nExpr + -1;
                *(ushort *)&_longNames->a[iVar8].fg.field_0x1 =
                     *(ushort *)&_longNames->a[iVar8].fg.field_0x1 & 0xfffc |
                     *(ushort *)&pList_00->a[pTabList._4_4_].fg.field_0x1 & 3;
                pList_00->a[pTabList._4_4_].zEName = (char *)0x0;
              }
              pList_00->a[pTabList._4_4_].pExpr = (Expr *)0x0;
            }
          }
          sqlite3ExprListDelete(db_00,pList_00);
          p->pEList = _longNames;
        }
        if (p->pEList != (ExprList *)0x0) {
          if (db_00->aLimit[2] < p->pEList->nExpr) {
            sqlite3ErrorMsg(pParse_00,"too many columns in result set");
            return 2;
          }
          if (((uint)pTab & 0x400008) != 0) {
            p->selFlags = p->selFlags | 0x40000;
          }
        }
        pWalker_local._4_4_ = 0;
      }
      else {
        pWalker_local._4_4_ = 2;
      }
    }
    else {
      pWalker_local._4_4_ = 1;
    }
  }
  else {
    pWalker_local._4_4_ = 2;
  }
  return pWalker_local._4_4_;
}

Assistant:

static int selectExpander(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  int i, j, k, rc;
  SrcList *pTabList;
  ExprList *pEList;
  SrcItem *pFrom;
  sqlite3 *db = pParse->db;
  Expr *pE, *pRight, *pExpr;
  u16 selFlags = p->selFlags;
  u32 elistFlags = 0;

  p->selFlags |= SF_Expanded;
  if( db->mallocFailed  ){
    return WRC_Abort;
  }
  assert( p->pSrc!=0 );
  if( (selFlags & SF_Expanded)!=0 ){
    return WRC_Prune;
  }
  if( pWalker->eCode ){
    /* Renumber selId because it has been copied from a view */
    p->selId = ++pParse->nSelect;
  }
  pTabList = p->pSrc;
  pEList = p->pEList;
  if( pParse->pWith && (p->selFlags & SF_View) ){
    if( p->pWith==0 ){
      p->pWith = (With*)sqlite3DbMallocZero(db, sizeof(With));
      if( p->pWith==0 ){
        return WRC_Abort;
      }
    }
    p->pWith->bView = 1;
  }
  sqlite3WithPush(pParse, p->pWith, 0);

  /* Make sure cursor numbers have been assigned to all entries in
  ** the FROM clause of the SELECT statement.
  */
  sqlite3SrcListAssignCursors(pParse, pTabList);

  /* Look up every table named in the FROM clause of the select.  If
  ** an entry of the FROM clause is a subquery instead of a table or view,
  ** then create a transient table structure to describe the subquery.
  */
  for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
    Table *pTab;
    assert( pFrom->fg.isRecursive==0 || pFrom->pTab!=0 );
    if( pFrom->pTab ) continue;
    assert( pFrom->fg.isRecursive==0 );
    if( pFrom->zName==0 ){
#ifndef SQLITE_OMIT_SUBQUERY
      Select *pSel = pFrom->pSelect;
      /* A sub-query in the FROM clause of a SELECT */
      assert( pSel!=0 );
      assert( pFrom->pTab==0 );
      if( sqlite3WalkSelect(pWalker, pSel) ) return WRC_Abort;
      if( sqlite3ExpandSubquery(pParse, pFrom) ) return WRC_Abort;
#endif
#ifndef SQLITE_OMIT_CTE
    }else if( (rc = resolveFromTermToCte(pParse, pWalker, pFrom))!=0 ){
      if( rc>1 ) return WRC_Abort;
      pTab = pFrom->pTab;
      assert( pTab!=0 );
#endif
    }else{
      /* An ordinary table or view name in the FROM clause */
      assert( pFrom->pTab==0 );
      pFrom->pTab = pTab = sqlite3LocateTableItem(pParse, 0, pFrom);
      if( pTab==0 ) return WRC_Abort;
      if( pTab->nTabRef>=0xffff ){
        sqlite3ErrorMsg(pParse, "too many references to \"%s\": max 65535",
           pTab->zName);
        pFrom->pTab = 0;
        return WRC_Abort;
      }
      pTab->nTabRef++;
      if( !IsVirtual(pTab) && cannotBeFunction(pParse, pFrom) ){
        return WRC_Abort;
      }
#if !defined(SQLITE_OMIT_VIEW) || !defined(SQLITE_OMIT_VIRTUALTABLE)
      if( !IsOrdinaryTable(pTab) ){
        i16 nCol;
        u8 eCodeOrig = pWalker->eCode;
        if( sqlite3ViewGetColumnNames(pParse, pTab) ) return WRC_Abort;
        assert( pFrom->pSelect==0 );
        if( IsView(pTab) ){
          if( (db->flags & SQLITE_EnableView)==0
           && pTab->pSchema!=db->aDb[1].pSchema
          ){
            sqlite3ErrorMsg(pParse, "access to view \"%s\" prohibited",
              pTab->zName);
          }
          pFrom->pSelect = sqlite3SelectDup(db, pTab->u.view.pSelect, 0);
        }
#ifndef SQLITE_OMIT_VIRTUALTABLE
        else if( ALWAYS(IsVirtual(pTab))
         && pFrom->fg.fromDDL
         && ALWAYS(pTab->u.vtab.p!=0)
         && pTab->u.vtab.p->eVtabRisk > ((db->flags & SQLITE_TrustedSchema)!=0)
        ){
          sqlite3ErrorMsg(pParse, "unsafe use of virtual table \"%s\"",
                                  pTab->zName);
        }
        assert( SQLITE_VTABRISK_Normal==1 && SQLITE_VTABRISK_High==2 );
#endif
        nCol = pTab->nCol;
        pTab->nCol = -1;
        pWalker->eCode = 1;  /* Turn on Select.selId renumbering */
        sqlite3WalkSelect(pWalker, pFrom->pSelect);
        pWalker->eCode = eCodeOrig;
        pTab->nCol = nCol;
      }
#endif
    }

    /* Locate the index named by the INDEXED BY clause, if any. */
    if( pFrom->fg.isIndexedBy && sqlite3IndexedByLookup(pParse, pFrom) ){
      return WRC_Abort;
    }
  }

  /* Process NATURAL keywords, and ON and USING clauses of joins.
  */
  assert( db->mallocFailed==0 || pParse->nErr!=0 );
  if( pParse->nErr || sqlite3ProcessJoin(pParse, p) ){
    return WRC_Abort;
  }

  /* For every "*" that occurs in the column list, insert the names of
  ** all columns in all tables.  And for every TABLE.* insert the names
  ** of all columns in TABLE.  The parser inserted a special expression
  ** with the TK_ASTERISK operator for each "*" that it found in the column
  ** list.  The following code just has to locate the TK_ASTERISK
  ** expressions and expand each one to the list of all columns in
  ** all tables.
  **
  ** The first loop just checks to see if there are any "*" operators
  ** that need expanding.
  */
  for(k=0; k<pEList->nExpr; k++){
    pE = pEList->a[k].pExpr;
    if( pE->op==TK_ASTERISK ) break;
    assert( pE->op!=TK_DOT || pE->pRight!=0 );
    assert( pE->op!=TK_DOT || (pE->pLeft!=0 && pE->pLeft->op==TK_ID) );
    if( pE->op==TK_DOT && pE->pRight->op==TK_ASTERISK ) break;
    elistFlags |= pE->flags;
  }
  if( k<pEList->nExpr ){
    /*
    ** If we get here it means the result set contains one or more "*"
    ** operators that need to be expanded.  Loop through each expression
    ** in the result set and expand them one by one.
    */
    struct ExprList_item *a = pEList->a;
    ExprList *pNew = 0;
    int flags = pParse->db->flags;
    int longNames = (flags & SQLITE_FullColNames)!=0
                      && (flags & SQLITE_ShortColNames)==0;

    for(k=0; k<pEList->nExpr; k++){
      pE = a[k].pExpr;
      elistFlags |= pE->flags;
      pRight = pE->pRight;
      assert( pE->op!=TK_DOT || pRight!=0 );
      if( pE->op!=TK_ASTERISK
       && (pE->op!=TK_DOT || pRight->op!=TK_ASTERISK)
      ){
        /* This particular expression does not need to be expanded.
        */
        pNew = sqlite3ExprListAppend(pParse, pNew, a[k].pExpr);
        if( pNew ){
          pNew->a[pNew->nExpr-1].zEName = a[k].zEName;
          pNew->a[pNew->nExpr-1].fg.eEName = a[k].fg.eEName;
          a[k].zEName = 0;
        }
        a[k].pExpr = 0;
      }else{
        /* This expression is a "*" or a "TABLE.*" and needs to be
        ** expanded. */
        int tableSeen = 0;      /* Set to 1 when TABLE matches */
        char *zTName = 0;       /* text of name of TABLE */
        if( pE->op==TK_DOT ){
          assert( pE->pLeft!=0 );
          assert( !ExprHasProperty(pE->pLeft, EP_IntValue) );
          zTName = pE->pLeft->u.zToken;
        }
        for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
          Table *pTab = pFrom->pTab;   /* Table for this data source */
          ExprList *pNestedFrom;       /* Result-set of a nested FROM clause */
          char *zTabName;              /* AS name for this data source */
          const char *zSchemaName = 0; /* Schema name for this data source */
          int iDb;                     /* Schema index for this data src */
          IdList *pUsing;              /* USING clause for pFrom[1] */

          if( (zTabName = pFrom->zAlias)==0 ){
            zTabName = pTab->zName;
          }
          if( db->mallocFailed ) break;
          assert( (int)pFrom->fg.isNestedFrom == IsNestedFrom(pFrom->pSelect) );
          if( pFrom->fg.isNestedFrom ){
            assert( pFrom->pSelect!=0 );
            pNestedFrom = pFrom->pSelect->pEList;
            assert( pNestedFrom!=0 );
            assert( pNestedFrom->nExpr==pTab->nCol );
          }else{
            if( zTName && sqlite3StrICmp(zTName, zTabName)!=0 ){
              continue;
            }
            pNestedFrom = 0;
            iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
            zSchemaName = iDb>=0 ? db->aDb[iDb].zDbSName : "*";
          }
          if( i+1<pTabList->nSrc
           && pFrom[1].fg.isUsing
           && (selFlags & SF_NestedFrom)!=0
          ){
            int ii;
            pUsing = pFrom[1].u3.pUsing;
            for(ii=0; ii<pUsing->nId; ii++){
              const char *zUName = pUsing->a[ii].zName;
              pRight = sqlite3Expr(db, TK_ID, zUName);
              pNew = sqlite3ExprListAppend(pParse, pNew, pRight);
              if( pNew ){
                struct ExprList_item *pX = &pNew->a[pNew->nExpr-1];
                assert( pX->zEName==0 );
                pX->zEName = sqlite3MPrintf(db,"..%s", zUName);
                pX->fg.eEName = ENAME_TAB;
                pX->fg.bUsingTerm = 1;
              }
            }
          }else{
            pUsing = 0;
          }
          for(j=0; j<pTab->nCol; j++){
            char *zName = pTab->aCol[j].zCnName;
            struct ExprList_item *pX; /* Newly added ExprList term */

            assert( zName );
            if( zTName
             && pNestedFrom
             && sqlite3MatchEName(&pNestedFrom->a[j], 0, zTName, 0)==0
            ){
              continue;
            }

            /* If a column is marked as 'hidden', omit it from the expanded
            ** result-set list unless the SELECT has the SF_IncludeHidden
            ** bit set.
            */
            if( (p->selFlags & SF_IncludeHidden)==0
             && IsHiddenColumn(&pTab->aCol[j])
            ){
              continue;
            }
            if( (pTab->aCol[j].colFlags & COLFLAG_NOEXPAND)!=0
             && zTName==0
             && (selFlags & (SF_NestedFrom))==0
            ){
              continue;
            }
            tableSeen = 1;

            if( i>0 && zTName==0 && (selFlags & SF_NestedFrom)==0 ){
              if( pFrom->fg.isUsing
               && sqlite3IdListIndex(pFrom->u3.pUsing, zName)>=0
              ){
                /* In a join with a USING clause, omit columns in the
                ** using clause from the table on the right. */
                continue;
              }
            }
            pRight = sqlite3Expr(db, TK_ID, zName);
            if( (pTabList->nSrc>1
                 && (  (pFrom->fg.jointype & JT_LTORJ)==0
                     || (selFlags & SF_NestedFrom)!=0
                     || !inAnyUsingClause(zName,pFrom,pTabList->nSrc-i-1)
                    )
                )
             || IN_RENAME_OBJECT
            ){
              Expr *pLeft;
              pLeft = sqlite3Expr(db, TK_ID, zTabName);
              pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pRight);
              if( IN_RENAME_OBJECT && pE->pLeft ){
                sqlite3RenameTokenRemap(pParse, pLeft, pE->pLeft);
              }
              if( zSchemaName ){
                pLeft = sqlite3Expr(db, TK_ID, zSchemaName);
                pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pExpr);
              }
            }else{
              pExpr = pRight;
            }
            pNew = sqlite3ExprListAppend(pParse, pNew, pExpr);
            if( pNew==0 ){
              break;  /* OOM */
            }
            pX = &pNew->a[pNew->nExpr-1];
            assert( pX->zEName==0 );
            if( (selFlags & SF_NestedFrom)!=0 && !IN_RENAME_OBJECT ){
              if( pNestedFrom ){
                pX->zEName = sqlite3DbStrDup(db, pNestedFrom->a[j].zEName);
                testcase( pX->zEName==0 );
              }else{
                pX->zEName = sqlite3MPrintf(db, "%s.%s.%s",
                                           zSchemaName, zTabName, zName);
                testcase( pX->zEName==0 );
              }
              pX->fg.eEName = ENAME_TAB;
              if( (pFrom->fg.isUsing
                   && sqlite3IdListIndex(pFrom->u3.pUsing, zName)>=0)
               || (pUsing && sqlite3IdListIndex(pUsing, zName)>=0)
               || (pTab->aCol[j].colFlags & COLFLAG_NOEXPAND)!=0
              ){
                pX->fg.bNoExpand = 1;
              }
            }else if( longNames ){
              pX->zEName = sqlite3MPrintf(db, "%s.%s", zTabName, zName);
              pX->fg.eEName = ENAME_NAME;
            }else{
              pX->zEName = sqlite3DbStrDup(db, zName);
              pX->fg.eEName = ENAME_NAME;
            }
          }
        }
        if( !tableSeen ){
          if( zTName ){
            sqlite3ErrorMsg(pParse, "no such table: %s", zTName);
          }else{
            sqlite3ErrorMsg(pParse, "no tables specified");
          }
        }
      }
    }
    sqlite3ExprListDelete(db, pEList);
    p->pEList = pNew;
  }
  if( p->pEList ){
    if( p->pEList->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
      sqlite3ErrorMsg(pParse, "too many columns in result set");
      return WRC_Abort;
    }
    if( (elistFlags & (EP_HasFunc|EP_Subquery))!=0 ){
      p->selFlags |= SF_ComplexResult;
    }
  }
#if TREETRACE_ENABLED
  if( sqlite3TreeTrace & 0x100 ){
    SELECTTRACE(0x100,pParse,p,("After result-set wildcard expansion:\n"));
    sqlite3TreeViewSelect(0, p, 0);
  }
#endif
  return WRC_Continue;
}